

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRationalAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imf_3_4::Rational>::readValueFrom
          (TypedAttribute<Imf_3_4::Rational> *this,IStream *is,int size,int version)

{
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,&(this->_value).n);
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(is,&(this->_value).d);
  return;
}

Assistant:

IMF_EXPORT void
RationalAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.n);
    Xdr::read<StreamIO> (is, _value.d);
}